

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

bool __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::
try_dequeue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>>
          (ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
           *this,unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                 *item)

{
  ulong uVar1;
  bool bVar2;
  ProducerBase *pPVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ProducerBase *pPVar7;
  ProducerBase *this_00;
  bool bVar8;
  
  pPVar3 = *(ProducerBase **)this;
  uVar4 = 0;
  this_00 = (ProducerBase *)0x0;
  uVar5 = 0;
  while ((uVar4 < 3 && (pPVar3 != (ProducerBase *)0x0))) {
    uVar6 = *(long *)(pPVar3 + 0x20) - *(long *)(pPVar3 + 0x28);
    if ((ulong)(*(long *)(pPVar3 + 0x28) - *(long *)(pPVar3 + 0x20)) < 0x8000000000000001) {
      uVar6 = 0;
    }
    pPVar7 = this_00;
    uVar1 = uVar5;
    if (uVar5 < uVar6) {
      pPVar7 = pPVar3;
      uVar1 = uVar6;
    }
    if (uVar6 != 0) {
      uVar5 = uVar1;
      this_00 = pPVar7;
    }
    uVar4 = uVar4 + (uVar6 != 0);
    pPVar7 = pPVar3 + 8;
    pPVar3 = (ProducerBase *)(*(long *)pPVar7 + -8);
    if (*(long *)pPVar7 == 0) {
      pPVar3 = (ProducerBase *)0x0;
    }
  }
  if (uVar4 == 0) {
    bVar8 = false;
  }
  else {
    bVar2 = ProducerBase::
            dequeue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>>
                      (this_00,item);
    bVar8 = true;
    if (!bVar2) {
      pPVar3 = *(ProducerBase **)this;
      while ((bVar8 = pPVar3 != (ProducerBase *)0x0, bVar8 &&
             ((pPVar3 == this_00 ||
              (bVar2 = ProducerBase::
                       dequeue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>>
                                 (pPVar3,item), !bVar2))))) {
        pPVar7 = pPVar3 + 8;
        pPVar3 = (ProducerBase *)(*(long *)pPVar7 + -8);
        if (*(long *)pPVar7 == 0) {
          pPVar3 = (ProducerBase *)0x0;
        }
      }
    }
  }
  return bVar8;
}

Assistant:

bool try_dequeue(U& item) {
    // Instead of simply trying each producer in turn (which could cause
    // needless contention on the first producer), we score them heuristically.
    size_t nonEmptyCount = 0;
    ProducerBase* best = nullptr;
    size_t bestSize = 0;
    for (auto ptr = producerListTail.load(std::memory_order_acquire);
         nonEmptyCount < 3 && ptr != nullptr; ptr = ptr->next_prod()) {
      auto size = ptr->size_approx();
      if (size > 0) {
        if (size > bestSize) {
          bestSize = size;
          best = ptr;
        }
        ++nonEmptyCount;
      }
    }

    // If there was at least one non-empty queue but it appears empty at the
    // time we try to dequeue from it, we need to make sure every queue's been
    // tried
    if (nonEmptyCount > 0) {
      if ((details::likely)(best->dequeue(item))) {
        return true;
      }
      for (auto ptr = producerListTail.load(std::memory_order_acquire);
           ptr != nullptr; ptr = ptr->next_prod()) {
        if (ptr != best && ptr->dequeue(item)) {
          return true;
        }
      }
    }
    return false;
  }